

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O0

void __thiscall MetaSim::Simulation::run(Simulation *this,Tick endTick,int nRuns)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  void *this_00;
  Tick TVar4;
  int in_EDX;
  long in_RDI;
  NoMoreEventsInQueue *e;
  bool terminateSim;
  bool initializeRuns;
  Simulation *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  Simulation *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  Tick local_8;
  
  if (in_EDX < -1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Initialize stats");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar2 = true;
    bVar1 = false;
    *(undefined8 *)(in_RDI + 0x60) = 1;
  }
  else if (in_EDX == -1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Will not initialize stats");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar2 = false;
    bVar1 = false;
    *(undefined8 *)(in_RDI + 0x60) = 1;
  }
  else {
    if (in_EDX == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Last Sim in the batch");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      bVar2 = false;
      *(undefined8 *)(in_RDI + 0x60) = 1;
    }
    else {
      if (in_EDX == 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"One single run");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        *(undefined8 *)(in_RDI + 0x60) = 1;
      }
      else {
        *(long *)(in_RDI + 0x60) = (long)in_EDX;
      }
      bVar2 = true;
    }
    bVar1 = true;
  }
  if (*(long *)(in_RDI + 0x60) == 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Warning: Simulation cannot be initialized with 2 runs");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"         Executing 3 runs!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    *(undefined8 *)(in_RDI + 0x60) = 3;
  }
  if (bVar2) {
    initRuns(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  *(undefined8 *)(in_RDI + 0x68) = 0;
  while (*(ulong *)(in_RDI + 0x68) < *(ulong *)(in_RDI + 0x60)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n Run #");
    this_00 = (void *)std::ostream::operator<<(poVar3,*(ulong *)(in_RDI + 0x68));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    initSingleRun(in_stack_ffffffffffffffa0);
    while (bVar2 = operator<((Tick *)(in_RDI + 0x70),&local_8), bVar2) {
      TVar4 = sim_step((Simulation *)CONCAT17(bVar2,in_stack_ffffffffffffffb8));
      *(impl_t *)(in_RDI + 0x70) = TVar4.v;
    }
    endSingleRun(in_stack_ffffffffffffffa0);
    *(long *)(in_RDI + 0x68) = *(long *)(in_RDI + 0x68) + 1;
  }
  *(undefined1 *)(in_RDI + 0x78) = 1;
  if (bVar1) {
    endSim((Simulation *)0x1f6191);
  }
  return;
}

Assistant:

void Simulation::run(Tick endTick, int nRuns) 
    {
        DBGENTER(_SIMUL_DBG_LEV);
        bool initializeRuns = true;
        bool terminateSim = true;
	
        if (nRuns < -1) {
            cout << "Initialize stats" << endl;
            initializeRuns = true;
            terminateSim = false;
            numRuns = 1;
            nRuns = -nRuns;
        }
        else if (nRuns == -1) {
            cout << "Will not initialize stats" << endl;
            initializeRuns = false;
            terminateSim = false;
            numRuns = 1;
        }
        else if (nRuns == 0) {
            cout << "Last Sim in the batch" << endl;
            initializeRuns = false;
            terminateSim = true;
            numRuns = 1;	    
        }
        else if (nRuns == 1) {
            cout << "One single run" << endl;
            initializeRuns = true;
            terminateSim = true; 
            numRuns = 1;	    
        }
        else numRuns = nRuns;

        if (numRuns == 2) {
            cout << "Warning: Simulation cannot be "
                "initialized with 2 runs" << endl;
            cout << "         Executing 3 runs!" << endl;
            numRuns = 3;
        }

        if (initializeRuns) initRuns(numRuns);

        // Ok, now starts the main cycle of the simulation.
        // remember that actRuns is the actual run number
        // while numRuns is the maximum number of runs.
        actRuns = 0;
        while (actRuns < numRuns) {
            cout << "\n Run #" << actRuns << endl;

            initSingleRun();

            // MAIN CYCLE!!
            try {
                while (globTime < endTick) {
                    globTime = sim_step();
                }
            } catch (NoMoreEventsInQueue &e) {
                cerr << "No more events in queue: simulation time =" 
                     << globTime << endl;
            }

            endSingleRun();
                                
            actRuns++;   // next run....
        }
        end = true;
        if (terminateSim) endSim();      // the simulation is over!!
    }